

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

string_view __thiscall
slang::ast::ElabSystemTaskSymbol::createMessage
          (ElabSystemTaskSymbol *this,ASTContext *context,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> args)

{
  char *pcVar1;
  FmtHelpers *this_00;
  Compilation *this_01;
  Segment *pSVar2;
  bool bVar3;
  byte *__dest;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_R8;
  undefined8 uVar4;
  string_view sVar5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> str;
  EvalContext evalCtx;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_278;
  bool local_258;
  undefined1 local_250 [16];
  EvalContext local_240;
  
  local_250._8_8_ = args.data_;
  local_250._0_8_ = context;
  bVar3 = FmtHelpers::checkDisplayArgs((ASTContext *)this,(Args *)local_250);
  if (bVar3) {
    this_00 = *(FmtHelpers **)&this->super_Symbol;
    if (this_00 == (FmtHelpers *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
    this_01 = *(Compilation **)this_00;
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
         (pointer)local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
    ;
    local_240.flags.m_bits = '\0';
    local_240._12_8_ = 0;
    local_240._20_8_ = 0;
    local_240.queueTarget._4_4_ = 0;
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
    local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
    pcVar1 = local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._0_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._1_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._2_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._3_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._4_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._5_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._6_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len._7_1_ = '\0';
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    local_240.diags.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_240.disableRange.startLoc = (SourceLocation)0x0;
    local_240.disableRange.endLoc = (SourceLocation)0x0;
    local_240.compilation = this_01;
    local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ = (pointer)pcVar1;
    FmtHelpers::formatDisplay_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_278,this_00,(Scope *)&local_240,(EvalContext *)local_250,in_R8);
    EvalContext::reportDiags(&local_240,(ASTContext *)this);
    __dest = (byte *)0x3f0621;
    if ((local_258 == true) && (local_278._M_value._M_string_length != 0)) {
      std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x3ea21d);
      pSVar2 = (this_01->super_BumpAllocator).head;
      __dest = pSVar2->current;
      if ((this_01->super_BumpAllocator).endPtr < __dest + local_278._M_value._M_string_length) {
        __dest = BumpAllocator::allocateSlow
                           (&this_01->super_BumpAllocator,local_278._M_value._M_string_length,1);
      }
      else {
        pSVar2->current = __dest + local_278._M_value._M_string_length;
      }
      this = (ElabSystemTaskSymbol *)local_278._M_value._M_dataplus._M_p;
      memcpy(__dest,(void *)local_278._M_value._M_dataplus._M_p,local_278._M_value._M_string_length)
      ;
      uVar4 = local_278._M_value._M_string_length;
    }
    else {
      uVar4 = 0;
    }
    if ((local_258 & 1U) != 0) {
      local_258 = false;
      if (local_278._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_278._M_value + 0x10)) {
        this = (ElabSystemTaskSymbol *)(local_278._16_8_ + 1);
        operator_delete((void *)local_278._M_value._M_dataplus._M_p,(ulong)this);
      }
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&local_240.diags,(EVP_PKEY_CTX *)this);
    if (local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ != (pointer)pcVar1) {
      free(local_240.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&local_240.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)this);
  }
  else {
    __dest = (byte *)0x3f0621;
    uVar4 = 0;
  }
  sVar5._M_str = (char *)__dest;
  sVar5._M_len = uVar4;
  return sVar5;
}

Assistant:

string_view ElabSystemTaskSymbol::createMessage(const ASTContext& context,
                                                span<const Expression* const> args) {
    // Check all arguments.
    if (!FmtHelpers::checkDisplayArgs(context, args))
        return ""sv;

    // Format the message to string.
    auto& comp = context.getCompilation();
    EvalContext evalCtx(comp);
    std::optional<std::string> str = FmtHelpers::formatDisplay(*context.scope, evalCtx, args);
    evalCtx.reportDiags(context);

    if (!str || str->empty())
        return ""sv;

    str->insert(0, ": ");

    // Copy the string into permanent memory.
    auto mem = comp.allocate(str->size(), alignof(char));
    memcpy(mem, str->data(), str->size());

    return string_view(reinterpret_cast<char*>(mem), str->size());
}